

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O0

void __thiscall value_precede::value_precede(value_precede *this,int _s,int _t,vec<IntVar_*> *vs)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  IntVar **ppIVar6;
  long lVar7;
  vec<IntVar_*> *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  IntVar *unaff_retaddr;
  int si;
  IntVar *x_1;
  uint ii_1;
  IntVar *x;
  bool t_seen;
  uint ii;
  IntVar *in_stack_fffffffffffffef0;
  IntVar *pIVar8;
  IntVar **in_stack_fffffffffffffef8;
  IntVar *in_stack_ffffffffffffff00;
  vec<IntVar_*> *this_00;
  int64_t in_stack_ffffffffffffff08;
  char o;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  anon_union_8_2_743a5d44_for_Reason_0 local_58;
  uint local_4c;
  IntVar *local_48;
  uint local_3c;
  IntVar *local_38;
  undefined1 local_29;
  uint local_28;
  vec<IntVar_*> *local_18;
  undefined4 local_10;
  undefined4 local_c;
  undefined8 *puVar9;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  puVar9 = in_RDI;
  Propagator::Propagator((Propagator *)in_stack_fffffffffffffef0);
  *in_RDI = &PTR__value_precede_0031cc30;
  *(undefined4 *)((long)in_RDI + 0x14) = local_c;
  *(undefined4 *)(in_RDI + 3) = local_10;
  vec<IntVar_*>::vec((vec<IntVar_*> *)(in_RDI + 4));
  Tint::Tint((Tint *)(in_RDI + 6));
  Tint::Tint((Tint *)((long)in_RDI + 0x34));
  Tint::Tint((Tint *)(in_RDI + 7));
  Tchar::Tchar((Tchar *)((long)in_RDI + 0x3c),'\0');
  for (local_28 = 0; uVar4 = local_28, uVar2 = vec<IntVar_*>::size(local_18), uVar4 < uVar2;
      local_28 = local_28 + 1) {
    vec<IntVar_*>::operator[](local_18,local_28);
    bVar1 = IntVar::indomain((IntVar *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                             ,in_stack_ffffffffffffff08);
    if (bVar1) {
      vec<IntVar_*>::operator[](local_18,local_28);
      int_rel(unaff_retaddr,(IntRelType)((ulong)puVar9 >> 0x20),(int)puVar9);
    }
    vec<IntVar_*>::operator[](local_18,local_28);
    bVar1 = IntVar::indomain((IntVar *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                             ,in_stack_ffffffffffffff08);
    if (bVar1) break;
  }
  local_29 = 0;
  Tint::operator=((Tint *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                  (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  for (; uVar4 = local_28, uVar2 = vec<IntVar_*>::size(local_18), uVar4 < uVar2;
      local_28 = local_28 + 1) {
    ppIVar6 = vec<IntVar_*>::operator[](local_18,local_28);
    local_38 = *ppIVar6;
    bVar1 = IntVar::isFixed(in_stack_fffffffffffffef0);
    if ((bVar1) &&
       (iVar3 = IntVar::getVal((IntVar *)0x1e10fc), iVar3 == *(int *)((long)in_RDI + 0x14))) break;
    bVar1 = IntVar::indomain((IntVar *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                             ,in_stack_ffffffffffffff08);
    if ((bVar1) ||
       (bVar1 = IntVar::indomain((IntVar *)
                                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                 in_stack_ffffffffffffff08), bVar1)) {
      vec<IntVar_*>::push((vec<IntVar_*> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      bVar1 = IntVar::isFixed(in_stack_fffffffffffffef0);
      if ((bVar1) && (iVar3 = IntVar::getVal((IntVar *)0x1e11b1), iVar3 == *(int *)(in_RDI + 3))) {
        local_29 = 1;
        break;
      }
    }
  }
  uVar4 = vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 4));
  if (uVar4 < 2) {
    Tchar::operator=((Tchar *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (char)((ulong)in_stack_ffffffffffffff08 >> 0x38));
  }
  else {
    for (local_3c = 0; uVar4 = local_3c, uVar2 = vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 4)),
        uVar4 < uVar2; local_3c = local_3c + 1) {
      ppIVar6 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 4),local_3c);
      local_48 = *ppIVar6;
      IntVar::specialiseToEL(in_stack_ffffffffffffff00);
      bVar1 = IntVar::indomain((IntVar *)
                               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                               in_stack_ffffffffffffff08);
      if (bVar1) {
        (*(local_48->super_Var).super_Branching._vptr_Branching[7])
                  (local_48,in_RDI,(ulong)(local_3c * 2),1);
      }
      bVar1 = IntVar::indomain((IntVar *)
                               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                               in_stack_ffffffffffffff08);
      if (bVar1) {
        (*(local_48->super_Var).super_Branching._vptr_Branching[7])
                  (local_48,in_RDI,(ulong)(local_3c * 2 + 1),8);
      }
    }
    vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 4));
    Tint::operator=((Tint *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    for (local_4c = 1; uVar4 = local_4c, uVar2 = vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 4)),
        (int)uVar4 < (int)uVar2; local_4c = local_4c + 1) {
      vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 4),local_4c);
      bVar1 = IntVar::indomain((IntVar *)
                               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                               in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff14 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff14);
      if (bVar1) break;
    }
    Tint::operator=((Tint *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    iVar3 = Tint::operator_cast_to_int((Tint *)(in_RDI + 7));
    iVar5 = Tint::operator_cast_to_int((Tint *)((long)in_RDI + 0x34));
    if (iVar3 <= iVar5) {
      this_00 = (vec<IntVar_*> *)(in_RDI + 4);
      uVar4 = Tint::operator_cast_to_int((Tint *)(in_RDI + 6));
      ppIVar6 = vec<IntVar_*>::operator[](this_00,uVar4);
      pIVar8 = *ppIVar6;
      lVar7 = (long)*(int *)((long)in_RDI + 0x14);
      Reason::Reason((Reason *)&local_58,(Clause *)0x0);
      o = (char)((ulong)ppIVar6 >> 0x38);
      iVar5 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0x10])
                        (pIVar8,lVar7,local_58._pt,1);
      if ((((byte)iVar5 ^ 0xff) & 1) != 0) {
        printf("=====UNSATISFIABLE=====\n");
        printf("%% Top level failure!\n");
        exit(0);
      }
      Tchar::operator=((Tchar *)CONCAT44(in_stack_ffffffffffffff14,iVar3),o);
    }
  }
  return;
}

Assistant:

value_precede(int _s, int _t, vec<IntVar*>& vs) : s(_s), t(_t), satisfied(0) {
		// Find the first possible occurrence of s.
		unsigned int ii = 0;
		// Can't do remVal before initialization.
		for (; ii < vs.size(); ii++) {
			if (vs[ii]->indomain(t)) {
				int_rel(vs[ii], IRT_NE, t);
			}
			if (vs[ii]->indomain(s)) {
				break;
			}
		}

		// Now copy the remaining values.
		bool t_seen = false;
		first_s = 0;
		for (; ii < vs.size(); ii++) {
			IntVar* x(vs[ii]);
			if (x->isFixed() && x->getVal() == s) {
				break;
			}

			if (!x->indomain(s) && !x->indomain(t)) {
				continue;
			}
			xs.push(x);

			if (x->isFixed() && x->getVal() == t) {
				t_seen = true;
				break;
			}
		}

		if (xs.size() <= 1) {
			satisfied = 1;
			return;
		}

		for (unsigned int ii = 0; ii < xs.size(); ii++) {
			IntVar* x(xs[ii]);
			x->specialiseToEL();
			if (x->indomain(s)) {
				x->attach(this, ii << 1, EVENT_C);
			}
			if (x->indomain(t)) {
				x->attach(this, (ii << 1) | 1, EVENT_F);
			}
		}

		first_t = xs.size() - static_cast<int>(t_seen);

		int si = 1;
		for (; si < static_cast<int>(xs.size()); ++si) {
			if (xs[si]->indomain(s)) {
				break;
			}
		}
		second_s = si;
		if (first_t <= second_s) {
			if (!xs[first_s]->setVal(s)) {
				TL_FAIL();
			}
			satisfied = 1;
		}
	}